

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O2

void __thiscall MapWrapper::freeAllItems(MapWrapper *this)

{
  LatencyItem *this_00;
  __node_base *p_Var1;
  
  p_Var1 = &(this->map)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    this_00 = (LatencyItem *)p_Var1[5]._M_nxt;
    if (this_00 != (LatencyItem *)0x0) {
      LatencyItem::~LatencyItem(this_00);
    }
    operator_delete(this_00);
  }
  return;
}

Assistant:

void freeAllItems() {
        for (auto& entry : map) {
            delete entry.second;
        }
    }